

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

uint __thiscall Js::JavascriptRegExp::GetSpecialPropertyCount(JavascriptRegExp *this)

{
  ThreadConfiguration *pTVar1;
  uint uVar2;
  
  pTVar1 = (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig;
  uVar2 = 1;
  if (pTVar1->m_ES6RegExPrototypeProperties == false) {
    uVar2 = (uint)pTVar1->m_ES2018RegExDotAll +
            (uint)pTVar1->m_ES6RegExSticky + (uint)pTVar1->m_ES6Unicode + 6;
  }
  return uVar2;
}

Assistant:

uint JavascriptRegExp::GetSpecialPropertyCount() const
    {
        if (GetScriptContext()->GetConfig()->IsES6RegExPrototypePropertiesEnabled())
        {
            return 1; // lastIndex
        }

        uint specialPropertyCount = defaultSpecialPropertyIdsCount;

        if (GetScriptContext()->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            specialPropertyCount += 1;
        }

        if (GetScriptContext()->GetConfig()->IsES6RegExStickyEnabled())
        {
            specialPropertyCount += 1;
        }

        if (GetScriptContext()->GetConfig()->IsES2018RegExDotAllEnabled())
        {
            specialPropertyCount += 1;
        }

        return specialPropertyCount;
    }